

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
CTtRenderMeshInfoUserData::Read(CTtRenderMeshInfoUserData *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  bool bVar2;
  int nVersion;
  ON__INT32 local_14;
  
  local_14 = 1;
  bVar1 = ON_BinaryArchive::ReadInt(binary_archive,&local_14);
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, local_14 == 1)) {
    bVar2 = ON_GeometryFingerprint::Read(&(this->m_info).m_geometryFingerprint,binary_archive);
    if (bVar2) {
      bVar2 = ON_BinaryArchive::ReadInt(binary_archive,&(this->m_info).m_sourceFaceId);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

virtual bool Read(ON_BinaryArchive& binary_archive)
  {
    if (!m_bArchive)
      return true;
    int nVersion = 1;
    if (!binary_archive.ReadInt(&nVersion))
      return false;
    if (1 != nVersion)
      return false;
    if (!m_info.m_geometryFingerprint.Read(binary_archive))
      return false;
    if (!binary_archive.ReadInt(&m_info.m_sourceFaceId))
      return false;
    return true;
  }